

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::NewActiveCornerReached
          (MeshEdgebreakerTraversalPredictiveDecoder *this,CornerIndex corner)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  CornerTable *pCVar4;
  pointer piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (corner.value_ == 0xffffffff) {
    uVar1 = 0xffffffff;
    uVar7 = uVar1;
  }
  else {
    uVar7 = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      uVar7 = corner.value_ + 1;
    }
    if (corner.value_ % 3 == 0) {
      uVar1 = corner.value_ + 2;
    }
    else {
      uVar1 = corner.value_ - 1;
    }
  }
  uVar6 = 0xffffffff;
  iVar3 = this->last_symbol_;
  switch(iVar3) {
  case 0:
  case 1:
    pCVar4 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (uVar7 != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar5 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5[uVar8] = piVar5[uVar8] + 1;
    break;
  default:
    goto switchD_00120263_caseD_2;
  case 3:
    pCVar4 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar5 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5[uVar8] = piVar5[uVar8] + 1;
    uVar8 = 0xffffffff;
    if (uVar7 != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar5[uVar8] = piVar5[uVar8] + 2;
    break;
  case 5:
    pCVar4 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar5 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5[uVar8] = piVar5[uVar8] + 1;
    uVar8 = 0xffffffff;
    if (uVar7 != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar5[uVar8] = piVar5[uVar8] + 1;
    goto LAB_00120374;
  case 7:
    pCVar4 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar5 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5[uVar8] = piVar5[uVar8] + 2;
    uVar8 = 0xffffffff;
    if (uVar7 != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
    piVar5[uVar8] = piVar5[uVar8] + 2;
LAB_00120374:
    uVar8 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar1].value_;
    }
    piVar2 = piVar5 + uVar8;
    iVar3 = 2;
    goto LAB_0012038e;
  }
  uVar8 = 0xffffffff;
  if (uVar1 != 0xffffffff) {
    uVar8 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar1].value_;
  }
  piVar2 = piVar5 + uVar8;
  iVar3 = 1;
LAB_0012038e:
  *piVar2 = *piVar2 + iVar3;
  iVar3 = this->last_symbol_;
switchD_00120263_caseD_2:
  if ((iVar3 != 5) && (iVar3 != 0)) {
    this->predicted_symbol_ = -1;
    return;
  }
  if (corner.value_ != 0xffffffff) {
    uVar7 = corner.value_ - 2;
    if ((corner.value_ + 1) % 3 != 0) {
      uVar7 = corner.value_ + 1;
    }
    if (uVar7 != 0xffffffff) {
      uVar6 = (ulong)(this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
    }
  }
  if ((this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] < 6) {
    this->predicted_symbol_ = 5;
    return;
  }
  this->predicted_symbol_ = 0;
  return;
}

Assistant:

inline void NewActiveCornerReached(CornerIndex corner) {
    const CornerIndex next = corner_table_->Next(corner);
    const CornerIndex prev = corner_table_->Previous(corner);
    // Update valences.
    switch (last_symbol_) {
      case TOPOLOGY_C:
      case TOPOLOGY_S:
        vertex_valences_[corner_table_->Vertex(next).value()] += 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 1;
        break;
      case TOPOLOGY_R:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 1;
        vertex_valences_[corner_table_->Vertex(next).value()] += 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 1;
        vertex_valences_[corner_table_->Vertex(next).value()] += 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 2;
        vertex_valences_[corner_table_->Vertex(next).value()] += 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 2;
        break;
      default:
        break;
    }
    // Compute the new predicted symbol.
    if (last_symbol_ == TOPOLOGY_C || last_symbol_ == TOPOLOGY_R) {
      const VertexIndex pivot =
          corner_table_->Vertex(corner_table_->Next(corner));
      if (vertex_valences_[pivot.value()] < 6) {
        predicted_symbol_ = TOPOLOGY_R;
      } else {
        predicted_symbol_ = TOPOLOGY_C;
      }
    } else {
      predicted_symbol_ = -1;
    }
  }